

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetInputMode(GLFWwindow *handle,int mode)

{
  _GLFWwindow *window;
  int mode_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfwInitialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      handle_local._4_4_ = 0;
    }
    else if (mode == 0x33001) {
      handle_local._4_4_ = *(int *)(handle + 0x70);
    }
    else if (mode == 0x33002) {
      handle_local._4_4_ = *(int *)(handle + 0x68);
    }
    else if (mode == 0x33003) {
      handle_local._4_4_ = *(int *)(handle + 0x6c);
    }
    else {
      _glfwInputError(0x10003,"Invalid input mode %i",(ulong)(uint)mode);
      handle_local._4_4_ = 0;
    }
    return handle_local._4_4_;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wei-Parker-Guo[P]PhongSphere/glfw-3.2.1/src/input.c"
                ,0x99,"int glfwGetInputMode(GLFWwindow *, int)");
}

Assistant:

GLFWAPI int glfwGetInputMode(GLFWwindow* handle, int mode)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (mode)
    {
        case GLFW_CURSOR:
            return window->cursorMode;
        case GLFW_STICKY_KEYS:
            return window->stickyKeys;
        case GLFW_STICKY_MOUSE_BUTTONS:
            return window->stickyMouseButtons;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode %i", mode);
            return 0;
    }
}